

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O0

SUNErrCode SUNMemoryHelper_Dealloc(SUNMemoryHelper helper,SUNMemory mem,void *queue)

{
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  SUNContext sunctx_local_scope_;
  SUNErrCode ier;
  undefined4 local_1c;
  
  if (in_RSI == 0) {
    local_1c = 0;
  }
  else {
    local_1c = (**(code **)(*(long *)(in_RDI + 8) + 8))(in_RDI,in_RSI,in_RDX);
  }
  return local_1c;
}

Assistant:

SUNErrCode SUNMemoryHelper_Dealloc(SUNMemoryHelper helper, SUNMemory mem,
                                   void* queue)
{
  SUNErrCode ier = SUN_SUCCESS;
  SUNFunctionBegin(helper->sunctx);
  SUNAssert(helper->ops->dealloc, SUN_ERR_NOT_IMPLEMENTED);
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(helper));
  if (!mem) { ier = SUN_SUCCESS; }
  else { ier = helper->ops->dealloc(helper, mem, queue); }
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(helper));
  return ier;
}